

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UBool isCnvAcceptable(void *param_1,char *param_2,char *param_3,UDataInfo *pInfo)

{
  bool local_29;
  UDataInfo *pInfo_local;
  char *param_2_local;
  char *param_1_local;
  void *param_0_local;
  
  local_29 = false;
  if (((((0x13 < pInfo->size) && (local_29 = false, pInfo->isBigEndian == '\0')) &&
       (local_29 = false, pInfo->charsetFamily == '\0')) &&
      ((local_29 = false, pInfo->sizeofUChar == '\x02' &&
       (local_29 = false, pInfo->dataFormat[0] == 'c')))) &&
     ((local_29 = false, pInfo->dataFormat[1] == 'n' &&
      ((local_29 = false, pInfo->dataFormat[2] == 'v' &&
       (local_29 = false, pInfo->dataFormat[3] == 't')))))) {
    local_29 = pInfo->formatVersion[0] == '\x06';
  }
  return local_29;
}

Assistant:

static UBool U_CALLCONV
isCnvAcceptable(void * /*context*/,
                const char * /*type*/, const char * /*name*/,
                const UDataInfo *pInfo) {
    return (UBool)(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->sizeofUChar==U_SIZEOF_UCHAR &&
        pInfo->dataFormat[0]==0x63 &&   /* dataFormat="cnvt" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x76 &&
        pInfo->dataFormat[3]==0x74 &&
        pInfo->formatVersion[0]==6);  /* Everything will be version 6 */
}